

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_ar_header(archive_write *a,archive_entry *entry)

{
  ulong *puVar1;
  int iVar2;
  mode_t mVar3;
  char *pcVar4;
  char *pcVar5;
  time_t v;
  la_int64_t lVar6;
  size_t sVar7;
  ulong local_98;
  int64_t size;
  char *filename;
  char *pathname;
  ar_w *ar;
  char *se;
  char *ss;
  char buff [60];
  int append_fn;
  int ret;
  archive_entry *entry_local;
  archive_write *a_local;
  
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  puVar1 = (ulong *)a->format_data;
  *(undefined4 *)(puVar1 + 2) = 0;
  size = 0;
  local_98 = archive_entry_size(entry);
  pcVar4 = archive_entry_pathname(entry);
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    archive_set_error(&a->archive,0x16,"Invalid filename");
    return -0x14;
  }
  if ((char)puVar1[3] == '\0') {
    __archive_write_output(a,"!<arch>\n",8);
    *(undefined1 *)(puVar1 + 3) = 1;
  }
  memset(&ss,0x20,0x3c);
  buff[0x32] = '`';
  buff[0x33] = '\n';
  iVar2 = strcmp(pcVar4,"/");
  if (iVar2 == 0) {
    ss = (char *)CONCAT71(ss._1_7_,0x2f);
  }
  else {
    iVar2 = strcmp(pcVar4,"/SYM64/");
    if (iVar2 == 0) {
      ss = (char *)CONCAT17(ss._7_1_,0x2f34364d59532f);
    }
    else {
      iVar2 = strcmp(pcVar4,"__.SYMDEF");
      if (iVar2 == 0) {
        ss = (char *)0x45444d59532e5f5f;
        buff[0] = 'F';
      }
      else {
        iVar2 = strcmp(pcVar4,"//");
        if (iVar2 == 0) {
          *(undefined4 *)(puVar1 + 2) = 1;
          ss = (char *)CONCAT62(ss._2_6_,0x2f00);
          ss = (char *)CONCAT71(ss._1_7_,0x2f);
          goto LAB_00c02447;
        }
        size = (int64_t)ar_basename(pcVar4);
        if ((char *)size == (char *)0x0) {
          archive_set_error(&a->archive,0x16,"Invalid filename");
          return -0x14;
        }
        if ((a->archive).archive_format == 0x70001) {
          sVar7 = strlen((char *)size);
          if (sVar7 < 0x10) {
            sVar7 = strlen((char *)size);
            memcpy(&ss,(void *)size,sVar7);
            sVar7 = strlen((char *)size);
            buff[sVar7 - 8] = '/';
          }
          else {
            if (*(int *)((long)puVar1 + 0x14) < 1) {
              archive_set_error(&a->archive,0x16,"Can\'t find string table");
              return -0x14;
            }
            sVar7 = strlen((char *)size);
            pcVar4 = (char *)malloc(sVar7 + 3);
            if (pcVar4 == (char *)0x0) {
              archive_set_error(&a->archive,0xc,"Can\'t allocate filename buffer");
              return -0x1e;
            }
            sVar7 = strlen((char *)size);
            memcpy(pcVar4,(void *)size,sVar7);
            sVar7 = strlen((char *)size);
            strcpy(pcVar4 + sVar7,"/\n");
            pcVar5 = strstr((char *)puVar1[4],pcVar4);
            free(pcVar4);
            if (pcVar5 == (char *)0x0) {
              archive_set_error(&a->archive,0x16,"Invalid string table");
              return -0x14;
            }
            ss = (char *)CONCAT71(ss._1_7_,0x2f);
            iVar2 = format_decimal((long)pcVar5 - puVar1[4],(char *)((long)&ss + 1),0xf);
            if (iVar2 != 0) {
              archive_set_error(&a->archive,0x22,"string table offset too large");
              return -0x14;
            }
          }
        }
        else if ((a->archive).archive_format == 0x70002) {
          sVar7 = strlen((char *)size);
          if ((sVar7 < 0x11) && (pcVar4 = strchr((char *)size,0x20), pcVar4 == (char *)0x0)) {
            sVar7 = strlen((char *)size);
            memcpy(&ss,(void *)size,sVar7);
            sVar7 = strlen((char *)size);
            buff[sVar7 - 8] = ' ';
          }
          else {
            ss = (char *)CONCAT53(ss._3_5_,0x2f3123);
            sVar7 = strlen((char *)size);
            iVar2 = format_decimal(sVar7,(char *)((long)&ss + 3),0xd);
            if (iVar2 != 0) {
              archive_set_error(&a->archive,0x22,"File name too long");
              return -0x14;
            }
            buff[0x38] = '\x01';
            buff[0x39] = '\0';
            buff[0x3a] = '\0';
            buff[0x3b] = '\0';
            sVar7 = strlen((char *)size);
            local_98 = sVar7 + local_98;
          }
        }
      }
    }
  }
  v = archive_entry_mtime(entry);
  iVar2 = format_decimal(v,buff + 8,0xc);
  if (iVar2 != 0) {
    archive_set_error(&a->archive,0x22,"File modification time too large");
    return -0x14;
  }
  lVar6 = archive_entry_uid(entry);
  iVar2 = format_decimal(lVar6,buff + 0x14,6);
  if (iVar2 != 0) {
    archive_set_error(&a->archive,0x22,"Numeric user ID too large");
    return -0x14;
  }
  lVar6 = archive_entry_gid(entry);
  iVar2 = format_decimal(lVar6,buff + 0x1a,6);
  if (iVar2 != 0) {
    archive_set_error(&a->archive,0x22,"Numeric group ID too large");
    return -0x14;
  }
  mVar3 = archive_entry_mode(entry);
  iVar2 = format_octal((ulong)mVar3,buff + 0x20,8);
  if (iVar2 != 0) {
    archive_set_error(&a->archive,0x22,"Numeric mode too large");
    return -0x14;
  }
  if ((size != 0) && (mVar3 = archive_entry_filetype(entry), mVar3 != 0x8000)) {
    archive_set_error(&a->archive,0x16,"Regular file required for non-pseudo member");
    return -0x14;
  }
LAB_00c02447:
  iVar2 = format_decimal(local_98,buff + 0x28,10);
  if (iVar2 == 0) {
    a_local._4_4_ = __archive_write_output(a,&ss,0x3c);
    if (a_local._4_4_ == 0) {
      *puVar1 = local_98;
      puVar1[1] = *puVar1 & 1;
      if (0 < (int)buff._56_4_) {
        sVar7 = strlen((char *)size);
        iVar2 = __archive_write_output(a,(void *)size,sVar7);
        if (iVar2 != 0) {
          return iVar2;
        }
        sVar7 = strlen((char *)size);
        *puVar1 = *puVar1 - sVar7;
      }
      a_local._4_4_ = 0;
    }
  }
  else {
    archive_set_error(&a->archive,0x22,"File size out of range");
    a_local._4_4_ = -0x14;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_ar_header(struct archive_write *a, struct archive_entry *entry)
{
	int ret, append_fn;
	char buff[60];
	char *ss, *se;
	struct ar_w *ar;
	const char *pathname;
	const char *filename;
	int64_t size;

	append_fn = 0;
	ar = (struct ar_w *)a->format_data;
	ar->is_strtab = 0;
	filename = NULL;
	size = archive_entry_size(entry);


	/*
	 * Reject files with empty name.
	 */
	pathname = archive_entry_pathname(entry);
	if (pathname == NULL || *pathname == '\0') {
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	/*
	 * If we are now at the beginning of the archive,
	 * we need first write the ar global header.
	 */
	if (!ar->wrote_global_header) {
		__archive_write_output(a, "!<arch>\n", 8);
		ar->wrote_global_header = 1;
	}

	memset(buff, ' ', 60);
	memcpy(&buff[AR_fmag_offset], "`\n", 2);

	if (strcmp(pathname, "/") == 0 ) {
		/* Entry is archive symbol table in GNU format */
		buff[AR_name_offset] = '/';
		goto stat;
	}
	if (strcmp(pathname, "/SYM64/") == 0) {
		/* Entry is archive symbol table in GNU 64-bit format */
		memcpy(buff + AR_name_offset, "/SYM64/", 7);
		goto stat;
	}
	if (strcmp(pathname, "__.SYMDEF") == 0) {
		/* Entry is archive symbol table in BSD format */
		memcpy(buff + AR_name_offset, "__.SYMDEF", 9);
		goto stat;
	}
	if (strcmp(pathname, "//") == 0) {
		/*
		 * Entry is archive filename table, inform that we should
		 * collect strtab in next _data call.
		 */
		ar->is_strtab = 1;
		buff[AR_name_offset] = buff[AR_name_offset + 1] = '/';
		/*
		 * For archive string table, only ar_size field should
		 * be set.
		 */
		goto size;
	}

	/*
	 * Otherwise, entry is a normal archive member.
	 * Strip leading paths from filenames, if any.
	 */
	if ((filename = ar_basename(pathname)) == NULL) {
		/* Reject filenames with trailing "/" */
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	if (a->archive.archive_format == ARCHIVE_FORMAT_AR_GNU) {
		/*
		 * SVR4/GNU variant use a "/" to mark then end of the filename,
		 * make it possible to have embedded spaces in the filename.
		 * So, the longest filename here (without extension) is
		 * actually 15 bytes.
		 */
		if (strlen(filename) <= 15) {
			memcpy(&buff[AR_name_offset],
			    filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = '/';
		} else {
			/*
			 * For filename longer than 15 bytes, GNU variant
			 * makes use of a string table and instead stores the
			 * offset of the real filename to in the ar_name field.
			 * The string table should have been written before.
			 */
			if (ar->has_strtab <= 0) {
				archive_set_error(&a->archive, EINVAL,
				    "Can't find string table");
				return (ARCHIVE_WARN);
			}

			se = (char *)malloc(strlen(filename) + 3);
			if (se == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate filename buffer");
				return (ARCHIVE_FATAL);
			}

			memcpy(se, filename, strlen(filename));
			strcpy(se + strlen(filename), "/\n");

			ss = strstr(ar->strtab, se);
			free(se);

			if (ss == NULL) {
				archive_set_error(&a->archive, EINVAL,
				    "Invalid string table");
				return (ARCHIVE_WARN);
			}

			/*
			 * GNU variant puts "/" followed by digits into
			 * ar_name field. These digits indicates the real
			 * filename string's offset to the string table.
			 */
			buff[AR_name_offset] = '/';
			if (format_decimal(ss - ar->strtab,
			    buff + AR_name_offset + 1,
			    AR_name_size - 1)) {
				archive_set_error(&a->archive, ERANGE,
				    "string table offset too large");
				return (ARCHIVE_WARN);
			}
		}
	} else if (a->archive.archive_format == ARCHIVE_FORMAT_AR_BSD) {
		/*
		 * BSD variant: for any file name which is more than
		 * 16 chars or contains one or more embedded space(s), the
		 * string "#1/" followed by the ASCII length of the name is
		 * put into the ar_name field. The file size (stored in the
		 * ar_size field) is incremented by the length of the name.
		 * The name is then written immediately following the
		 * archive header.
		 */
		if (strlen(filename) <= 16 && strchr(filename, ' ') == NULL) {
			memcpy(&buff[AR_name_offset], filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = ' ';
		}
		else {
			memcpy(buff + AR_name_offset, "#1/", 3);
			if (format_decimal(strlen(filename),
			    buff + AR_name_offset + 3,
			    AR_name_size - 3)) {
				archive_set_error(&a->archive, ERANGE,
				    "File name too long");
				return (ARCHIVE_WARN);
			}
			append_fn = 1;
			size += strlen(filename);
		}
	}

stat:
	if (format_decimal(archive_entry_mtime(entry), buff + AR_date_offset, AR_date_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File modification time too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_uid(entry), buff + AR_uid_offset, AR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_gid(entry), buff + AR_gid_offset, AR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_octal(archive_entry_mode(entry), buff + AR_mode_offset, AR_mode_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric mode too large");
		return (ARCHIVE_WARN);
	}
	/*
	 * Sanity Check: A non-pseudo archive member should always be
	 * a regular file.
	 */
	if (filename != NULL && archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, EINVAL,
		    "Regular file required for non-pseudo member");
		return (ARCHIVE_WARN);
	}

size:
	if (format_decimal(size, buff + AR_size_offset, AR_size_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, buff, 60);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining = size;
	ar->entry_padding = ar->entry_bytes_remaining % 2;

	if (append_fn > 0) {
		ret = __archive_write_output(a, filename, strlen(filename));
		if (ret != ARCHIVE_OK)
			return (ret);
		ar->entry_bytes_remaining -= strlen(filename);
	}

	return (ARCHIVE_OK);
}